

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_av1.c
# Opt level: O2

uint obmc_sad(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,int width,int height)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)width;
  if (width < 1) {
    uVar4 = uVar5;
  }
  if (height < 1) {
    height = 0;
  }
  uVar1 = 0;
  for (; (int)uVar5 != height; uVar5 = (ulong)((int)uVar5 + 1)) {
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      iVar3 = wsrc[uVar2] - (uint)pre[uVar2] * mask[uVar2];
      iVar6 = -iVar3;
      if (0 < iVar3) {
        iVar6 = iVar3;
      }
      uVar1 = uVar1 + (iVar6 + 0x800U >> 0xc);
    }
    pre = pre + pre_stride;
    mask = mask + (uint)width;
    wsrc = wsrc + (uint)width;
  }
  return uVar1;
}

Assistant:

static inline unsigned int obmc_sad(const uint8_t *pre, int pre_stride,
                                    const int32_t *wsrc, const int32_t *mask,
                                    int width, int height) {
  int y, x;
  unsigned int sad = 0;

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++)
      sad += ROUND_POWER_OF_TWO(abs(wsrc[x] - pre[x] * mask[x]), 12);

    pre += pre_stride;
    wsrc += width;
    mask += width;
  }

  return sad;
}